

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

_Bool rsa_verify(RSAKey *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  _Bool _Var6;
  
  uVar1 = mp_hs_integer(key->p,2);
  uVar2 = mp_hs_integer(key->q,2);
  if ((uVar2 & uVar1) == 0) {
    _Var6 = false;
  }
  else {
    pmVar4 = mp_mul(key->p,key->q);
    uVar1 = mp_cmp_eq(pmVar4,key->modulus);
    mp_free(pmVar4);
    pmVar4 = mp_copy(key->p);
    mp_sub_integer_into(pmVar4,pmVar4,1);
    pmVar5 = mp_modmul(key->exponent,key->private_exponent,pmVar4);
    mp_free(pmVar4);
    uVar2 = mp_eq_integer(pmVar5,1);
    mp_free(pmVar5);
    pmVar4 = mp_copy(key->q);
    mp_sub_integer_into(pmVar4,pmVar4,1);
    pmVar5 = mp_modmul(key->exponent,key->private_exponent,pmVar4);
    mp_free(pmVar4);
    uVar3 = mp_eq_integer(pmVar5,1);
    mp_free(pmVar5);
    pmVar4 = mp_max(key->p,key->q);
    pmVar5 = mp_min(key->p,key->q);
    mp_free(key->p);
    mp_free(key->q);
    mp_free(key->iqmp);
    key->p = pmVar4;
    key->q = pmVar5;
    pmVar4 = mp_invert(pmVar5,pmVar4);
    key->iqmp = pmVar4;
    _Var6 = (_Bool)((byte)uVar3 & (byte)uVar2 & (byte)uVar1 & 1);
  }
  return _Var6;
}

Assistant:

bool rsa_verify(RSAKey *key)
{
    mp_int *n, *ed, *pm1, *qm1;
    unsigned ok = 1;

    /* Preliminary checks: p,q can't be 0 or 1. (Of course no other
     * very small value is any good either, but these are the values
     * we _must_ check for to avoid assertion failures further down
     * this function.) */
    if (!(mp_hs_integer(key->p, 2) & mp_hs_integer(key->q, 2)))
        return false;

    /* n must equal pq. */
    n = mp_mul(key->p, key->q);
    ok &= mp_cmp_eq(n, key->modulus);
    mp_free(n);

    /* e * d must be congruent to 1, modulo (p-1) and modulo (q-1). */
    pm1 = mp_copy(key->p);
    mp_sub_integer_into(pm1, pm1, 1);
    ed = mp_modmul(key->exponent, key->private_exponent, pm1);
    mp_free(pm1);
    ok &= mp_eq_integer(ed, 1);
    mp_free(ed);

    qm1 = mp_copy(key->q);
    mp_sub_integer_into(qm1, qm1, 1);
    ed = mp_modmul(key->exponent, key->private_exponent, qm1);
    mp_free(qm1);
    ok &= mp_eq_integer(ed, 1);
    mp_free(ed);

    /*
     * Ensure p > q.
     *
     * I have seen key blobs in the wild which were generated with
     * p < q, so instead of rejecting the key in this case we
     * should instead flip them round into the canonical order of
     * p > q. This also involves regenerating iqmp.
     */
    mp_int *p_new = mp_max(key->p, key->q);
    mp_int *q_new = mp_min(key->p, key->q);
    mp_free(key->p);
    mp_free(key->q);
    mp_free(key->iqmp);
    key->p = p_new;
    key->q = q_new;
    key->iqmp = mp_invert(key->q, key->p);

    return ok;
}